

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delaunay.c
# Opt level: O3

int deletePointAtIndex(DelaunayTriangulation *delTri,GLsizei i_p)

{
  GLfloat (*paGVar1) [2];
  long lVar2;
  GLfloat (*paGVar3) [2];
  long lVar4;
  ulong uVar5;
  int iVar6;
  
  lVar2 = (long)delTri->n_points;
  if (lVar2 != 0) {
    iVar6 = (int)(lVar2 + -1);
    delTri->n_points = iVar6;
    paGVar3 = (GLfloat (*) [2])malloc(lVar2 * 8 - 8);
    if (0 < i_p) {
      paGVar1 = delTri->points;
      uVar5 = 0;
      do {
        paGVar3[uVar5][0] = paGVar1[uVar5][0];
        paGVar3[uVar5][1] = paGVar1[uVar5][1];
        uVar5 = uVar5 + 1;
      } while ((uint)i_p != uVar5);
    }
    paGVar1 = delTri->points;
    if (i_p < iVar6) {
      lVar4 = (long)i_p;
      do {
        paGVar3[lVar4][0] = paGVar1[lVar4 + 1][0];
        paGVar3[lVar4][1] = paGVar1[lVar4 + 1][1];
        lVar4 = lVar4 + 1;
      } while (lVar2 + -1 != lVar4);
    }
    free(paGVar1);
    delTri->points = paGVar3;
    resetDelaunayTriangulation(delTri);
    return 1;
  }
  return 0;
}

Assistant:

int deletePointAtIndex(DelaunayTriangulation *delTri, GLsizei i_p) {
	if (delTri->n_points == 0) {
		return 0;
	}

	delTri->n_points -= 1;
	GLfloat (*points)[2] = malloc(sizeof(delTri->points[0]) * delTri->n_points);

	for (GLsizei i = 0; i < i_p; i++) {
		points[i][0] = delTri->points[i][0];
		points[i][1] = delTri->points[i][1];
	}
	for (GLsizei i = i_p; i < delTri->n_points; i++) {
		points[i][0] = delTri->points[i + 1][0];
		points[i][1] = delTri->points[i + 1][1];
	}

	free(delTri->points);
	delTri->points = points;

	resetDelaunayTriangulation(delTri);
	return 1;
}